

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::GetCommissionerDataset
          (CommissionerImpl *this,Handler<CommissionerDataset> *aHandler,uint16_t aDatasetFlags)

{
  bool bVar1;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  Error local_300;
  ErrorCode local_2d8;
  anon_class_1_0_00000001 local_2d2;
  v10 local_2d1;
  v10 *local_2d0;
  size_t local_2c8;
  string local_2c0;
  allocator local_299;
  string local_298;
  ResponseHandler local_278;
  ErrorCode local_254;
  Tlv local_250;
  Error local_230;
  ErrorCode local_208;
  allocator local_201;
  string local_200;
  Error local_1e0;
  undefined1 local_1b8 [8];
  anon_class_32_1_d0c21527 onResponse;
  ByteArray tlvTypes;
  undefined1 local_170 [8];
  Request request;
  Error error;
  uint16_t aDatasetFlags_local;
  Handler<CommissionerDataset> *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  CommissionerImpl **local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  CommissionerImpl **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_170,kConfirmable,kPost);
  GetCommissionerDatasetTlvs((ByteArray *)&onResponse.aHandler._M_invoker,aDatasetFlags);
  std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
  function((function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>
            *)local_1b8,aHandler);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"/c/cg",&local_201);
  coap::Message::SetUriPath(&local_1e0,(Message *)local_170,&local_200);
  aError = Error::operator=((Error *)&request.mEndpoint,&local_1e0);
  local_208 = kNone;
  bVar1 = commissioner::operator!=(aError,&local_208);
  Error::~Error(&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  if (!bVar1) {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &onResponse.aHandler._M_invoker);
    if (!bVar1) {
      tlv::Tlv::Tlv(&local_250,kGet,(ByteArray *)&onResponse.aHandler._M_invoker,kMeshCoP);
      AppendTlv(&local_230,(Message *)local_170,&local_250);
      local_254 = kNone;
      bVar1 = commissioner::operator!=(&local_230,&local_254);
      Error::~Error(&local_230);
      tlv::Tlv::~Tlv(&local_250);
      if (bVar1) goto LAB_0023ed47;
    }
    std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
    function<ot::commissioner::CommissionerImpl::GetCommissionerDataset(std::function<void(ot::commissioner::CommissionerDataset_const*,ot::commissioner::Error)>,unsigned_short)::__0&,void>
              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
               &local_278,(anon_class_32_1_d0c21527 *)local_1b8);
    ProxyClient::SendRequest(&this->mProxyClient,(Request *)local_170,&local_278,0xfc00,0xf0bf);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    ~function(&local_278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_298,"mgmt",&local_299);
    GetCommissionerDataset::anon_class_1_0_00000001::operator()(&local_2d2);
    local_58 = &local_2d0;
    local_60 = &local_2d1;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_2c8 = bVar2.size_;
    local_2d0 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_2c0;
    local_78 = local_2d0;
    sStack_70 = local_2c8;
    local_50 = &local_78;
    local_88 = local_2d0;
    local_80 = local_2c8;
    local_48 = local_88;
    sStack_40 = local_80;
    this_local = (CommissionerImpl *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &this_local;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_2c0,local_88,fmt,args);
    Log(kDebug,&local_298,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
LAB_0023ed47:
  local_2d8 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_2d8);
  if (bVar1) {
    Error::Error(&local_300,(Error *)&request.mEndpoint);
    std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
    operator()(aHandler,(CommissionerDataset *)0x0,&local_300);
    Error::~Error(&local_300);
  }
  GetCommissionerDataset(std::function<void(ot::commissioner::CommissionerDataset_const*,ot::commissioner::Error)>,unsigned_short)
  ::$_0::~__0((__0 *)local_1b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &onResponse.aHandler._M_invoker);
  coap::Message::~Message((Message *)local_170);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::GetCommissionerDataset(Handler<CommissionerDataset> aHandler, uint16_t aDatasetFlags)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     tlvTypes = GetCommissionerDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error               error;
        CommissionerDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodeCommissionerDataset(dataset, *aResponse));

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtCommissionerGet));

    // If Get TLV is not present, get all Commissioner Dataset TLVs.
    if (!tlvTypes.empty())
    {
        SuccessOrExit(AppendTlv(request, {tlv::Type::kGet, tlvTypes}));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_COMMISSIONER_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}